

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_seq_parameter_set_rbsp(sps_t *sps,bs_t *b)

{
  uint32_t uVar1;
  int32_t iVar2;
  int *useDefaultScalingMatrixFlag;
  int iVar3;
  ulong uVar4;
  int (*scalingList) [16];
  int *piVar5;
  int (*paiVar6) [16];
  int (*paiVar7) [16];
  long lVar8;
  
  memset(sps,0,0x1028);
  sps->chroma_format_idc = 1;
  uVar1 = bs_read_u8(b);
  sps->profile_idc = uVar1;
  uVar1 = bs_read_u1(b);
  sps->constraint_set0_flag = uVar1;
  uVar1 = bs_read_u1(b);
  sps->constraint_set1_flag = uVar1;
  uVar1 = bs_read_u1(b);
  sps->constraint_set2_flag = uVar1;
  uVar1 = bs_read_u1(b);
  sps->constraint_set3_flag = uVar1;
  uVar1 = bs_read_u1(b);
  sps->constraint_set4_flag = uVar1;
  uVar1 = bs_read_u1(b);
  sps->constraint_set5_flag = uVar1;
  bs_skip_u(b,2);
  uVar1 = bs_read_u8(b);
  sps->level_idc = uVar1;
  uVar1 = bs_read_ue(b);
  sps->seq_parameter_set_id = uVar1;
  iVar3 = sps->profile_idc;
  if ((((iVar3 - 0x53U < 0x39) && ((0x188208808020009U >> ((ulong)(iVar3 - 0x53U) & 0x3f) & 1) != 0)
       ) || (iVar3 == 0xf4)) || (iVar3 == 0x2c)) {
    uVar1 = bs_read_ue(b);
    sps->chroma_format_idc = uVar1;
    if (uVar1 == 3) {
      uVar1 = bs_read_u1(b);
      sps->residual_colour_transform_flag = uVar1;
    }
    uVar1 = bs_read_ue(b);
    sps->bit_depth_luma_minus8 = uVar1;
    uVar1 = bs_read_ue(b);
    sps->bit_depth_chroma_minus8 = uVar1;
    uVar1 = bs_read_u1(b);
    sps->qpprime_y_zero_transform_bypass_flag = uVar1;
    uVar1 = bs_read_u1(b);
    sps->seq_scaling_matrix_present_flag = uVar1;
    if (uVar1 != 0) {
      paiVar7 = sps->ScalingList4x4;
      piVar5 = sps->ScalingList8x8[5] + 0x3a;
      paiVar6 = (int (*) [16])(sps[-1].offset_for_ref_frame + 0xfd);
      for (uVar4 = 0; uVar4 < (ulong)(sps->chroma_format_idc == 3) * 4 + 8; uVar4 = uVar4 + 1) {
        uVar1 = bs_read_u1(b);
        piVar5[-0x1ec] = uVar1;
        if (uVar1 != 0) {
          if (uVar4 < 6) {
            iVar3 = 0x10;
            useDefaultScalingMatrixFlag = piVar5 + -0x180;
            scalingList = paiVar7;
          }
          else {
            iVar3 = 0x40;
            useDefaultScalingMatrixFlag = piVar5;
            scalingList = paiVar6;
          }
          read_scaling_list(b,*scalingList,iVar3,useDefaultScalingMatrixFlag);
        }
        piVar5 = piVar5 + 1;
        paiVar6 = paiVar6 + 4;
        paiVar7 = paiVar7 + 1;
      }
    }
  }
  uVar1 = bs_read_ue(b);
  sps->log2_max_frame_num_minus4 = uVar1;
  uVar1 = bs_read_ue(b);
  sps->pic_order_cnt_type = uVar1;
  if (uVar1 == 1) {
    uVar1 = bs_read_u1(b);
    sps->delta_pic_order_always_zero_flag = uVar1;
    iVar2 = bs_read_se(b);
    sps->offset_for_non_ref_pic = iVar2;
    iVar2 = bs_read_se(b);
    sps->offset_for_top_to_bottom_field = iVar2;
    uVar1 = bs_read_ue(b);
    sps->num_ref_frames_in_pic_order_cnt_cycle = uVar1;
    for (lVar8 = 0; lVar8 < (int)uVar1; lVar8 = lVar8 + 1) {
      iVar2 = bs_read_se(b);
      sps->offset_for_ref_frame[lVar8] = iVar2;
      uVar1 = sps->num_ref_frames_in_pic_order_cnt_cycle;
    }
  }
  else if (uVar1 == 0) {
    uVar1 = bs_read_ue(b);
    sps->log2_max_pic_order_cnt_lsb_minus4 = uVar1;
  }
  uVar1 = bs_read_ue(b);
  sps->num_ref_frames = uVar1;
  uVar1 = bs_read_u1(b);
  sps->gaps_in_frame_num_value_allowed_flag = uVar1;
  uVar1 = bs_read_ue(b);
  sps->pic_width_in_mbs_minus1 = uVar1;
  uVar1 = bs_read_ue(b);
  sps->pic_height_in_map_units_minus1 = uVar1;
  uVar1 = bs_read_u1(b);
  sps->frame_mbs_only_flag = uVar1;
  if (uVar1 == 0) {
    uVar1 = bs_read_u1(b);
    sps->mb_adaptive_frame_field_flag = uVar1;
  }
  uVar1 = bs_read_u1(b);
  sps->direct_8x8_inference_flag = uVar1;
  uVar1 = bs_read_u1(b);
  sps->frame_cropping_flag = uVar1;
  if (uVar1 != 0) {
    uVar1 = bs_read_ue(b);
    sps->frame_crop_left_offset = uVar1;
    uVar1 = bs_read_ue(b);
    sps->frame_crop_right_offset = uVar1;
    uVar1 = bs_read_ue(b);
    sps->frame_crop_top_offset = uVar1;
    uVar1 = bs_read_ue(b);
    sps->frame_crop_bottom_offset = uVar1;
  }
  uVar1 = bs_read_u1(b);
  sps->vui_parameters_present_flag = uVar1;
  if (uVar1 != 0) {
    read_vui_parameters(sps,b);
    return;
  }
  return;
}

Assistant:

void read_seq_parameter_set_rbsp(sps_t* sps, bs_t* b)
{
    int i;

    if( 1 )
    {
        memset(sps, 0, sizeof(sps_t));
        sps->chroma_format_idc = 1; 
    }
 
    sps->profile_idc = bs_read_u8(b);
    sps->constraint_set0_flag = bs_read_u1(b);
    sps->constraint_set1_flag = bs_read_u1(b);
    sps->constraint_set2_flag = bs_read_u1(b);
    sps->constraint_set3_flag = bs_read_u1(b);
    sps->constraint_set4_flag = bs_read_u1(b);
    sps->constraint_set5_flag = bs_read_u1(b);
    /* reserved_zero_2bits */ bs_skip_u(b, 2);
    sps->level_idc = bs_read_u8(b);
    sps->seq_parameter_set_id = bs_read_ue(b);

    if( sps->profile_idc == 100 || sps->profile_idc == 110 ||
        sps->profile_idc == 122 || sps->profile_idc == 244 ||
        sps->profile_idc == 44 || sps->profile_idc == 83 ||
        sps->profile_idc == 86 || sps->profile_idc == 118 ||
        sps->profile_idc == 128 || sps->profile_idc == 138 ||
        sps->profile_idc == 139 || sps->profile_idc == 134
       )
    {
        sps->chroma_format_idc = bs_read_ue(b);
        if( sps->chroma_format_idc == 3 )
        {
            sps->residual_colour_transform_flag = bs_read_u1(b);
        }
        sps->bit_depth_luma_minus8 = bs_read_ue(b);
        sps->bit_depth_chroma_minus8 = bs_read_ue(b);
        sps->qpprime_y_zero_transform_bypass_flag = bs_read_u1(b);
        sps->seq_scaling_matrix_present_flag = bs_read_u1(b);
        if( sps->seq_scaling_matrix_present_flag )
        {
            for( i = 0; i < ((sps->chroma_format_idc != 3) ? 8 : 12); i++ )
            {
                sps->seq_scaling_list_present_flag[ i ] = bs_read_u1(b);
                if( sps->seq_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_scaling_list( b, sps->ScalingList4x4[ i ], 16,
                                                 &( sps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        read_scaling_list( b, sps->ScalingList8x8[ i - 6 ], 64,
                                                 &( sps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
    }
    sps->log2_max_frame_num_minus4 = bs_read_ue(b);
    sps->pic_order_cnt_type = bs_read_ue(b);
    if( sps->pic_order_cnt_type == 0 )
    {
        sps->log2_max_pic_order_cnt_lsb_minus4 = bs_read_ue(b);
    }
    else if( sps->pic_order_cnt_type == 1 )
    {
        sps->delta_pic_order_always_zero_flag = bs_read_u1(b);
        sps->offset_for_non_ref_pic = bs_read_se(b);
        sps->offset_for_top_to_bottom_field = bs_read_se(b);
        sps->num_ref_frames_in_pic_order_cnt_cycle = bs_read_ue(b);
        for( i = 0; i < sps->num_ref_frames_in_pic_order_cnt_cycle; i++ )
        {
            sps->offset_for_ref_frame[ i ] = bs_read_se(b);
        }
    }
    sps->num_ref_frames = bs_read_ue(b);
    sps->gaps_in_frame_num_value_allowed_flag = bs_read_u1(b);
    sps->pic_width_in_mbs_minus1 = bs_read_ue(b);
    sps->pic_height_in_map_units_minus1 = bs_read_ue(b);
    sps->frame_mbs_only_flag = bs_read_u1(b);
    if( !sps->frame_mbs_only_flag )
    {
        sps->mb_adaptive_frame_field_flag = bs_read_u1(b);
    }
    sps->direct_8x8_inference_flag = bs_read_u1(b);
    sps->frame_cropping_flag = bs_read_u1(b);
    if( sps->frame_cropping_flag )
    {
        sps->frame_crop_left_offset = bs_read_ue(b);
        sps->frame_crop_right_offset = bs_read_ue(b);
        sps->frame_crop_top_offset = bs_read_ue(b);
        sps->frame_crop_bottom_offset = bs_read_ue(b);
    }
    sps->vui_parameters_present_flag = bs_read_u1(b);
    if( sps->vui_parameters_present_flag )
    {
        read_vui_parameters(sps, b);
    }
}